

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O3

int read_float_info(WavpackStream *wps,WavpackMetadata *wpmd)

{
  uchar *puVar1;
  bool bVar2;
  
  bVar2 = wpmd->byte_length == 4;
  if (bVar2) {
    puVar1 = (uchar *)wpmd->data;
    wps->float_flags = *puVar1;
    wps->float_shift = puVar1[1];
    wps->float_max_exp = puVar1[2];
    wps->float_norm_exp = puVar1[3];
  }
  return (uint)bVar2;
}

Assistant:

int read_float_info (WavpackStream *wps, WavpackMetadata *wpmd)
{
    int bytecnt = wpmd->byte_length;
    char *byteptr = wpmd->data;

    if (bytecnt != 4)
        return FALSE;

    wps->float_flags = *byteptr++;
    wps->float_shift = *byteptr++;
    wps->float_max_exp = *byteptr++;
    wps->float_norm_exp = *byteptr;
    return TRUE;
}